

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_usadd_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 v1;
  uintptr_t o;
  
  v1 = tcg_const_i32_tricore(tcg_ctx,-1);
  tcg_gen_add_i32(tcg_ctx,d,a,b);
  tcg_gen_movcond_i32_tricore(tcg_ctx,TCG_COND_LTU,d,d,a,v1,d);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_usadd_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 max = tcg_const_i32(tcg_ctx, -1);
    tcg_gen_add_i32(tcg_ctx, d, a, b);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, d, d, a, max, d);
    tcg_temp_free_i32(tcg_ctx, max);
}